

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
          (NonAnsiPortListBuilder *this,ValueSymbol *symbol,DeclaratorSyntax *decl,
          DataTypeSyntax *dataType,PortInfo *info)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  bool bVar1;
  SymbolIndex index;
  DeclaredType *pDVar2;
  __extent_storage<18446744073709551615UL> in_RCX;
  SyntaxNode *in_RDX;
  AttributeInstanceSyntax *in_RSI;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_RDI;
  pointer in_R8;
  ValueSymbol *in_stack_ffffffffffffff98;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_ffffffffffffffa0;
  ValueSymbol *in_stack_ffffffffffffffb0;
  
  Symbol::setSyntax((Symbol *)in_RSI,in_RDX);
  syntax._M_extent._M_extent_value = in_RCX._M_extent_value;
  syntax._M_ptr = in_R8;
  Symbol::setAttributes((Symbol *)in_R8[2],(Scope *)in_R8[1],syntax);
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
  emplace_back<slang::ast::ValueSymbol*,slang::ast::Symbol_const*&>
            (in_RDI,(ValueSymbol **)in_stack_ffffffffffffffa0,(Symbol **)in_stack_ffffffffffffff98);
  in_R8[3] = in_RSI;
  if (in_RCX._M_extent_value == 0) {
    bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                      ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                       0x51a392);
    if (!bVar1) {
      ValueSymbol::getDeclaredType(in_stack_ffffffffffffff98);
      pDVar2 = not_null<slang::ast::DeclaredType_*>::operator->
                         ((not_null<slang::ast::DeclaredType_*> *)0x51a3af);
      DeclaredType::setDimensionSyntax
                (pDVar2,(SyntaxList<slang::syntax::VariableDimensionSyntax> *)&in_RDX[1].previewNode
                );
    }
  }
  else {
    ValueSymbol::setDeclaredType
              (in_stack_ffffffffffffffb0,(DataTypeSyntax *)in_RDI,in_stack_ffffffffffffffa0);
  }
  if (in_R8[4] != (AttributeInstanceSyntax *)0x0) {
    ValueSymbol::getDeclaredType(in_stack_ffffffffffffff98);
    pDVar2 = not_null<slang::ast::DeclaredType_*>::operator->
                       ((not_null<slang::ast::DeclaredType_*> *)0x51a3e7);
    index = Symbol::getIndex((Symbol *)in_R8[4]);
    DeclaredType::setOverrideIndex(pDVar2,index);
  }
  return;
}

Assistant:

void setInternalSymbol(ValueSymbol& symbol, const DeclaratorSyntax& decl,
                           const DataTypeSyntax* dataType, PortInfo& info) {
        symbol.setSyntax(decl);
        symbol.setAttributes(scope, info.attrs);
        implicitMembers.emplace_back(&symbol, info.insertionPoint);
        info.internalSymbol = &symbol;

        if (dataType)
            symbol.setDeclaredType(*dataType, decl.dimensions);
        else if (!decl.dimensions.empty())
            symbol.getDeclaredType()->setDimensionSyntax(decl.dimensions);

        if (info.insertionPoint)
            symbol.getDeclaredType()->setOverrideIndex(info.insertionPoint->getIndex());
    }